

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::InitializeKeyValue<std::__cxx11::string>
          (MapFieldBase *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  Arena *pAVar1;
  ThreadSafeArena *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  MapFieldBase *this_local;
  
  std::__cxx11::string::string((string *)v);
  pAVar1 = arena(this);
  if ((pAVar1 != (Arena *)0x0) &&
     (this_00 = &arena(this)->impl_,
     v != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    ThreadSafeArena::AddCleanup(this_00,v,cleanup::arena_destruct_object<std::__cxx11::string>);
  }
  return;
}

Assistant:

void InitializeKeyValue(T* v, const U&... init) {
    ::new (static_cast<void*>(v)) T(init...);
    if constexpr (std::is_same_v<std::string, T>) {
      if (arena() != nullptr) {
        arena()->OwnDestructor(v);
      }
    }
  }